

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkDirFrame.cpp
# Opt level: O1

ChVectorDynamic<> __thiscall
chrono::fea::ChLinkDirFrame::GetConstraintViolation(ChLinkDirFrame *this)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  void *pvVar6;
  undefined8 *puVar7;
  _func_int **pp_Var8;
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index IVar9;
  ActualDstType actualDst;
  long in_RSI;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  ChVectorDynamic<> CVar30;
  ChQuaternion<double> q;
  ChMatrix33<double> Arw;
  ChQuaternion<double> local_88;
  ChMatrix33<double> local_60;
  
  lVar5 = *(long *)(in_RSI + 0x1d0);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(lVar5 + 0x20);
  dVar1 = *(double *)(lVar5 + 0x28);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar1;
  dVar2 = *(double *)(in_RSI + 0x1f8);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar2;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(double *)(in_RSI + 0x200);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(double *)(in_RSI + 0x200) * dVar1;
  auVar15 = vfmsub231sd_fma(auVar20,auVar10,auVar15);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(double *)(lVar5 + 0x30);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(in_RSI + 0x208);
  auVar15 = vfnmadd231sd_fma(auVar15,auVar22,auVar24);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(double *)(lVar5 + 0x38);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(in_RSI + 0x210);
  auVar20 = vfnmadd231sd_fma(auVar15,auVar25,auVar26);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar2 * dVar1;
  auVar15 = vfmadd231sd_fma(auVar28,auVar10,auVar18);
  auVar15 = vfnmadd231sd_fma(auVar15,auVar25,auVar24);
  auVar15 = vfmadd231sd_fma(auVar15,auVar22,auVar26);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar2 * *(double *)(lVar5 + 0x30);
  auVar16 = vfmadd231sd_fma(auVar29,auVar10,auVar24);
  auVar16 = vfmadd231sd_fma(auVar16,auVar25,auVar18);
  auVar25 = vfnmadd231sd_fma(auVar16,auVar13,auVar26);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar2 * *(double *)(lVar5 + 0x38);
  auVar16 = vfmadd231sd_fma(auVar16,auVar10,auVar26);
  auVar16 = vfnmadd231sd_fma(auVar16,auVar22,auVar18);
  auVar16 = vfmadd231sd_fma(auVar16,auVar13,auVar24);
  local_88.m_data[0] = auVar20._0_8_;
  local_88.m_data[1] = auVar15._0_8_;
  local_88.m_data[2] = auVar25._0_8_;
  local_88.m_data[3] = auVar16._0_8_;
  ChMatrix33<double>::ChMatrix33(&local_60,&local_88);
  lVar5 = *(long *)(in_RSI + 0x1c0);
  uVar3 = *(ulong *)(lVar5 + 0xf0);
  dVar1 = *(double *)(lVar5 + 0xf8);
  uVar4 = *(ulong *)(lVar5 + 0x100);
  (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj = (_func_int **)0x0;
  (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p = (pointer)0x0;
  IVar9 = extraout_RDX;
  if ((this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p !=
      (pointer)0x2) {
    pp_Var8 = (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj;
    if (pp_Var8 != (_func_int **)0x0) {
      free(pp_Var8[-1]);
    }
    pvVar6 = malloc(0x50);
    if (pvVar6 == (void *)0x0) {
      pp_Var8 = (_func_int **)0x0;
    }
    else {
      *(void **)(((ulong)pvVar6 & 0xffffffffffffffc0) + 0x38) = pvVar6;
      pp_Var8 = (_func_int **)(((ulong)pvVar6 & 0xffffffffffffffc0) + 0x40);
    }
    if (pp_Var8 == (_func_int **)0x0) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar7 = std::ostream::_M_insert<bool>;
      __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj = pp_Var8;
    IVar9 = extraout_RDX_00;
  }
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar4;
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar3;
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       dVar1;
  auVar15 = vfmadd213sd_fma(auVar27,auVar14,auVar11);
  auVar15 = vfmadd213sd_fma(auVar23,auVar17,auVar15);
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       dVar1 * local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4];
  auVar16 = vfmadd213sd_fma(auVar19,auVar14,auVar12);
  auVar16 = vfmadd213sd_fma(auVar21,auVar17,auVar16);
  (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p = (pointer)0x2;
  pp_Var8 = (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj;
  *pp_Var8 = auVar16._0_8_;
  pp_Var8[1] = auVar15._0_8_;
  CVar30.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar9;
  CVar30.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (ChVectorDynamic<>)
         CVar30.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

ChVectorDynamic<> ChLinkDirFrame::GetConstraintViolation() const {
    ChMatrix33<> Arw = m_csys.rot >> m_body->coord.rot;
    ChVector<> res = Arw.transpose() * m_node->GetD();
    ChVectorN<double, 2> C;
    C(0) = res.y();
    C(1) = res.z();
    return C;
}